

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateStFldWithCachedType
          (Lowerer *this,Instr *instrStFld,bool *continueAsHelperOut,LabelInstr **labelHelperOut,
          RegOpnd **typeOpndOut)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  Func *propertySymOpnd_00;
  bool *pbVar4;
  bool bVar5;
  uint uVar6;
  uint functionId;
  BailOutKind BVar7;
  PropertyId PVar8;
  undefined4 *puVar9;
  Opnd *pOVar10;
  SymOpnd *this_00;
  PropertySymOpnd *this_01;
  BVSparse<Memory::JitArenaAllocator> *pBVar11;
  char16 *pcVar12;
  PropertySym *pPVar13;
  JITTimeFunctionBody *this_02;
  char16 *pcVar14;
  char16 *pcVar15;
  char16_t *pcVar16;
  JITType *this_03;
  JITTypeHandler *this_04;
  IntConstOpnd *opndArg;
  Instr *instr_00;
  JITTypeHolder initialType;
  JITTypeHolder finalType;
  BailOutInfo *pBVar17;
  bool local_101;
  LabelInstr *local_f0;
  bool local_e1;
  bool emitAddProperty;
  Instr *invalidateCallInstr;
  undefined1 local_7b;
  byte local_7a;
  bool local_79;
  bool isPrototypeTypeHandler;
  bool isTypeChecked;
  Func *pFStack_78;
  bool hasTypeCheckBailout;
  Func *func;
  PropertySymOpnd *propertySymOpnd;
  LabelInstr *labelDone;
  LabelInstr *labelBothTypeChecksFailed;
  LabelInstr *labelTypeCheckFailed;
  LabelInstr *labelObjCheckFailed;
  RegOpnd *typeOpnd;
  Instr *instr;
  RegOpnd **typeOpndOut_local;
  LabelInstr **labelHelperOut_local;
  bool *continueAsHelperOut_local;
  Instr *instrStFld_local;
  Lowerer *this_local;
  
  labelObjCheckFailed = (LabelInstr *)0x0;
  labelTypeCheckFailed = (LabelInstr *)0x0;
  labelBothTypeChecksFailed = (LabelInstr *)0x0;
  labelDone = (LabelInstr *)0x0;
  propertySymOpnd = (PropertySymOpnd *)0x0;
  instr = (Instr *)typeOpndOut;
  typeOpndOut_local = (RegOpnd **)labelHelperOut;
  labelHelperOut_local = (LabelInstr **)continueAsHelperOut;
  continueAsHelperOut_local = (bool *)instrStFld;
  instrStFld_local = (Instr *)this;
  if (continueAsHelperOut == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cdb,"(continueAsHelperOut != nullptr)","continueAsHelperOut != nullptr");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  *(undefined1 *)labelHelperOut_local = 0;
  if (typeOpndOut_local == (RegOpnd **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cde,"(labelHelperOut != nullptr)","labelHelperOut != nullptr");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  *typeOpndOut_local = (RegOpnd *)0x0;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ce1,"(typeOpndOut != nullptr)","typeOpndOut != nullptr");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  instr->_vptr_Instr = (_func_int **)0x0;
  pOVar10 = IR::Instr::GetDst((Instr *)continueAsHelperOut_local);
  bVar5 = IR::Opnd::IsSymOpnd(pOVar10);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ce4,"(instrStFld->GetDst()->IsSymOpnd())",
                       "instrStFld->GetDst()->IsSymOpnd()");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pOVar10 = IR::Instr::GetDst((Instr *)continueAsHelperOut_local);
  this_00 = IR::Opnd::AsSymOpnd(pOVar10);
  bVar5 = IR::SymOpnd::IsPropertySymOpnd(this_00);
  if (bVar5) {
    pOVar10 = IR::Instr::GetDst((Instr *)continueAsHelperOut_local);
    this_01 = IR::Opnd::AsPropertySymOpnd(pOVar10);
    bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
    if (bVar5) {
      pOVar10 = IR::Instr::GetDst((Instr *)continueAsHelperOut_local);
      func = (Func *)IR::Opnd::AsPropertySymOpnd(pOVar10);
      bVar5 = IR::PropertySymOpnd::HasObjTypeSpecFldInfo((PropertySymOpnd *)func);
      if ((bVar5) &&
         (bVar5 = IR::PropertySymOpnd::IsLoadedFromProto((PropertySymOpnd *)func), bVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1cee,
                           "(!propertySymOpnd->HasObjTypeSpecFldInfo() || !propertySymOpnd->IsLoadedFromProto())"
                           ,
                           "!propertySymOpnd->HasObjTypeSpecFldInfo() || !propertySymOpnd->IsLoadedFromProto()"
                          );
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      bVar5 = IR::PropertySymOpnd::TypeCheckSeqBitsSetOnlyIfCandidate((PropertySymOpnd *)func);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1cf0,"(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate())",
                           "Property sym operand optimized despite not being a candidate?");
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate((PropertySymOpnd *)func);
      if (!bVar5) {
        return false;
      }
      bVar5 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant((PropertySymOpnd *)func);
      if ((!bVar5) &&
         (bVar5 = IR::PropertySymOpnd::NeedsLocalTypeCheck((PropertySymOpnd *)func), !bVar5)) {
        return false;
      }
      bVar5 = IR::PropertySymOpnd::NeedsTypeCheckAndBailOut((PropertySymOpnd *)func);
      if (bVar5) {
        bVar5 = IR::Instr::HasBailOutInfo((Instr *)continueAsHelperOut_local);
        if (bVar5) {
          BVar7 = IR::Instr::GetBailOutKind((Instr *)continueAsHelperOut_local);
          bVar5 = IR::IsTypeCheckBailOutKind(BVar7);
          if (bVar5) goto LAB_007c1999;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1cfc,
                           "(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind())))"
                           ,
                           "!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind()))"
                          );
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
LAB_007c1999:
      bVar5 = IR::PropertySymOpnd::IsTypeCheckProtected((PropertySymOpnd *)func);
      if ((bVar5) &&
         (pBVar11 = IR::PropertySymOpnd::GetGuardedPropOps((PropertySymOpnd *)func),
         pBVar11 != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1d00,
                           "(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr)"
                           ,
                           "!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr"
                          );
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      uVar6 = Func::GetSourceContextId(this->m_func);
      functionId = Func::GetLocalFunctionId(this->m_func);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,ObjTypeSpecPhase,uVar6,functionId);
      if (bVar5) {
        pcVar12 = Js::OpCodeUtil::GetOpCodeName(*(OpCode *)(continueAsHelperOut_local + 0x30));
        pPVar13 = Sym::AsPropertySym((Sym *)func->m_threadContextInfo);
        uVar1 = pPVar13->m_propertyId;
        this_02 = Func::GetJITFunctionBody(this->m_func);
        pcVar14 = JITTimeFunctionBody::GetDisplayName(this_02);
        uVar2 = *(uint *)&func->m_workItem;
        pcVar15 = IR::PropertySymOpnd::GetCacheLayoutString((PropertySymOpnd *)func);
        bVar5 = IR::PropertySymOpnd::IsTypeChecked((PropertySymOpnd *)func);
        pcVar16 = L"false";
        if (bVar5) {
          pcVar16 = L"true";
        }
        Output::Print(L"Field store: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"
                      ,pcVar12,(ulong)uVar1,pcVar14,(ulong)uVar2,pcVar15,pcVar16);
        Output::Flush();
      }
      bVar5 = IR::PropertySymOpnd::HasFinalType((PropertySymOpnd *)func);
      if ((bVar5) &&
         (bVar5 = IR::PropertySymOpnd::IsLoadedFromProto((PropertySymOpnd *)func), !bVar5)) {
        IR::PropertySymOpnd::UpdateSlotForFinalType((PropertySymOpnd *)func);
      }
      pFStack_78 = *(Func **)(continueAsHelperOut_local + 0x20);
      bVar5 = IR::Instr::HasBailOutInfo((Instr *)continueAsHelperOut_local);
      local_e1 = false;
      if (bVar5) {
        BVar7 = IR::Instr::GetBailOutKind((Instr *)continueAsHelperOut_local);
        local_e1 = IR::IsTypeCheckBailOutKind(BVar7);
      }
      local_79 = local_e1;
      local_7a = IR::PropertySymOpnd::IsTypeChecked((PropertySymOpnd *)func);
      if (!(bool)local_7a) {
        bVar5 = IR::PropertySymOpnd::HasFinalType((PropertySymOpnd *)func);
        if (((bVar5) &&
            (bVar5 = IR::PropertySymOpnd::HasInitialType((PropertySymOpnd *)func), bVar5)) &&
           (bVar5 = IR::PropertySymOpnd::IsTypeDead((PropertySymOpnd *)func), !bVar5)) {
          bVar5 = GenerateStFldWithCachedFinalType
                            (this,(Instr *)continueAsHelperOut_local,(PropertySymOpnd *)func);
          return bVar5;
        }
        bVar5 = IR::PropertySymOpnd::HasTypeMismatch((PropertySymOpnd *)func);
        if (bVar5) {
          return false;
        }
        bVar5 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck((PropertySymOpnd *)func);
        if ((!bVar5) &&
           (bVar5 = IR::PropertySymOpnd::NeedsLocalTypeCheck((PropertySymOpnd *)func), !bVar5)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1d35,
                             "(propertySymOpnd->NeedsPrimaryTypeCheck() || propertySymOpnd->NeedsLocalTypeCheck())"
                             ,
                             "propertySymOpnd->NeedsPrimaryTypeCheck() || propertySymOpnd->NeedsLocalTypeCheck()"
                            );
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        labelBothTypeChecksFailed = IR::LabelInstr::New(Label,pFStack_78,true);
        local_f0 = IR::LabelInstr::New(Label,pFStack_78,true);
        labelDone = local_f0;
        if ((local_79 & 1U) == 0) {
          local_f0 = IR::LabelInstr::New(Label,pFStack_78,true);
        }
        labelTypeCheckFailed = local_f0;
        labelObjCheckFailed =
             (LabelInstr *)
             GenerateCachedTypeCheck
                       (this,(Instr *)continueAsHelperOut_local,(PropertySymOpnd *)func,local_f0,
                        labelDone,labelBothTypeChecksFailed);
        instr->_vptr_Instr = (_func_int **)labelObjCheckFailed;
      }
      GenerateDirectFieldStore(this,(Instr *)continueAsHelperOut_local,(PropertySymOpnd *)func);
      if ((local_7a & 1) != 0) {
        if ((labelBothTypeChecksFailed != (LabelInstr *)0x0) || (labelDone != (LabelInstr *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1d46,
                             "(labelTypeCheckFailed == nullptr && labelBothTypeChecksFailed == nullptr)"
                             ,
                             "labelTypeCheckFailed == nullptr && labelBothTypeChecksFailed == nullptr"
                            );
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        bVar5 = IR::Instr::HasBailOutInfo((Instr *)continueAsHelperOut_local);
        if ((bVar5) &&
           (bVar5 = IR::Instr::OnlyHasLazyBailOut((Instr *)continueAsHelperOut_local), !bVar5)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1d4a,
                             "(!instrStFld->HasBailOutInfo() || instrStFld->OnlyHasLazyBailOut())",
                             "Why does a direct field store have bailout that is not lazy?");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        bVar5 = IR::PropertySymOpnd::HasInitialType((PropertySymOpnd *)func);
        if ((bVar5) && (bVar5 = IR::PropertySymOpnd::HasFinalType((PropertySymOpnd *)func), bVar5))
        {
          invalidateCallInstr =
               (Instr *)IR::PropertySymOpnd::GetInitialType((PropertySymOpnd *)func);
          this_03 = JITTypeHolderBase<void>::operator->
                              ((JITTypeHolderBase<void> *)&invalidateCallInstr);
          this_04 = JITType::GetTypeHandler(this_03);
          local_7b = JITTypeHandler::IsPrototype(this_04);
          if ((bool)local_7b) {
            LoadScriptContext(this,(Instr *)continueAsHelperOut_local);
            pbVar4 = continueAsHelperOut_local;
            PVar8 = IR::PropertySymOpnd::GetPropertyId((PropertySymOpnd *)func);
            opndArg = IR::IntConstOpnd::New((long)PVar8,TyInt32,this->m_func,true);
            LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)pbVar4,&opndArg->super_Opnd);
            instr_00 = IR::Instr::New(Call,this->m_func);
            IR::Instr::InsertBefore((Instr *)continueAsHelperOut_local,instr_00);
            LowererMD::ChangeToHelperCall
                      (&this->m_lowererMD,instr_00,HelperInvalidateProtoCaches,(LabelInstr *)0x0,
                       (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
          }
        }
        IR::Instr::Remove((Instr *)continueAsHelperOut_local);
        return true;
      }
      propertySymOpnd = (PropertySymOpnd *)IR::LabelInstr::New(Label,pFStack_78,false);
      typeOpnd = (RegOpnd *)IR::BranchInstr::New(JMP,(LabelInstr *)propertySymOpnd,pFStack_78);
      IR::Instr::InsertBefore((Instr *)continueAsHelperOut_local,(Instr *)typeOpnd);
      IR::Instr::InsertBefore
                ((Instr *)continueAsHelperOut_local,&labelBothTypeChecksFailed->super_Instr);
      bVar5 = IR::PropertySymOpnd::IsMono((PropertySymOpnd *)func);
      local_101 = false;
      if (bVar5) {
        local_101 = IR::PropertySymOpnd::HasInitialType((PropertySymOpnd *)func);
      }
      if (local_101 != false) {
        GenerateCachedTypeWithoutPropertyCheck
                  (this,(Instr *)continueAsHelperOut_local,(PropertySymOpnd *)func,
                   (Opnd *)labelObjCheckFailed,labelDone);
        pbVar4 = continueAsHelperOut_local;
        propertySymOpnd_00 = func;
        initialType = IR::PropertySymOpnd::GetInitialType((PropertySymOpnd *)func);
        finalType = IR::PropertySymOpnd::GetType((PropertySymOpnd *)func);
        GenerateFieldStoreWithTypeChange
                  (this,(Instr *)pbVar4,(PropertySymOpnd *)propertySymOpnd_00,initialType,finalType)
        ;
        typeOpnd = (RegOpnd *)IR::BranchInstr::New(JMP,(LabelInstr *)propertySymOpnd,pFStack_78);
        IR::Instr::InsertBefore((Instr *)continueAsHelperOut_local,(Instr *)typeOpnd);
      }
      IR::Instr::InsertBefore((Instr *)continueAsHelperOut_local,&labelDone->super_Instr);
      IR::Instr::InsertAfter((Instr *)continueAsHelperOut_local,(Instr *)propertySymOpnd);
      if ((local_79 & 1U) != 0) {
        pBVar17 = IR::Instr::GetBailOutInfo((Instr *)continueAsHelperOut_local);
        if (pBVar17->bailOutInstr == (Instr *)continueAsHelperOut_local) {
          pBVar17 = IR::Instr::GetBailOutInfo((Instr *)continueAsHelperOut_local);
          if (pBVar17->polymorphicCacheIndex != *(uint *)&func->m_workItem) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x1d80,
                               "(instrStFld->GetBailOutInfo()->polymorphicCacheIndex == propertySymOpnd->m_inlineCacheIndex)"
                               ,
                               "instrStFld->GetBailOutInfo()->polymorphicCacheIndex == propertySymOpnd->m_inlineCacheIndex"
                              );
            if (!bVar5) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
        }
        else {
          uVar6 = *(uint *)&func->m_workItem;
          pBVar17 = IR::Instr::GetBailOutInfo((Instr *)continueAsHelperOut_local);
          pBVar17->polymorphicCacheIndex = uVar6;
        }
        continueAsHelperOut_local[0x30] = true;
        continueAsHelperOut_local[0x31] = true;
        IR::Instr::FreeSrc1((Instr *)continueAsHelperOut_local);
        IR::Instr::FreeDst((Instr *)continueAsHelperOut_local);
        GenerateBailOut(this,(Instr *)continueAsHelperOut_local,(BranchInstr *)0x0,(LabelInstr *)0x0
                        ,(LabelInstr *)0x0);
        return true;
      }
      *(undefined1 *)labelHelperOut_local = 1;
      if ((labelTypeCheckFailed == (LabelInstr *)0x0) || (labelTypeCheckFailed == labelDone)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1d8d,
                           "(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelBothTypeChecksFailed)"
                           ,
                           "labelObjCheckFailed != nullptr && labelObjCheckFailed != labelBothTypeChecksFailed"
                          );
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      *typeOpndOut_local = (RegOpnd *)labelTypeCheckFailed;
      return false;
    }
  }
  return false;
}

Assistant:

bool
Lowerer::GenerateStFldWithCachedType(IR::Instr *instrStFld, bool* continueAsHelperOut, IR::LabelInstr** labelHelperOut, IR::RegOpnd** typeOpndOut)
{
    IR::Instr *instr;
    IR::RegOpnd *typeOpnd = nullptr;
    IR::LabelInstr* labelObjCheckFailed  = nullptr;
    IR::LabelInstr *labelTypeCheckFailed = nullptr;
    IR::LabelInstr *labelBothTypeChecksFailed = nullptr;
    IR::LabelInstr *labelDone = nullptr;

    Assert(continueAsHelperOut != nullptr);
    *continueAsHelperOut = false;

    Assert(labelHelperOut != nullptr);
    *labelHelperOut = nullptr;

    Assert(typeOpndOut != nullptr);
    *typeOpndOut = nullptr;

    Assert(instrStFld->GetDst()->IsSymOpnd());
    if (!instrStFld->GetDst()->AsSymOpnd()->IsPropertySymOpnd() || !instrStFld->GetDst()->AsPropertySymOpnd()->IsTypeCheckSeqCandidate())
    {
        return false;
    }

    IR::PropertySymOpnd *propertySymOpnd = instrStFld->GetDst()->AsPropertySymOpnd();

    // If we have any object type spec info, we better not believe this is a load from prototype, since this is a store
    // and we never share inline caches between loads and stores.
    Assert(!propertySymOpnd->HasObjTypeSpecFldInfo() || !propertySymOpnd->IsLoadedFromProto());

    AssertMsg(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate(), "Property sym operand optimized despite not being a candidate?");

    if (!propertySymOpnd->IsTypeCheckSeqCandidate())
    {
        return false;
    }

    if (!propertySymOpnd->IsTypeCheckSeqParticipant() && !propertySymOpnd->NeedsLocalTypeCheck())
    {
        return false;
    }

    Assert(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind())));

    // In the backwards pass we only add guarded property operations to instructions that are not already
    // protected by an upstream type check.
    Assert(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr);

    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Field store: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"),
        Js::OpCodeUtil::GetOpCodeName(instrStFld->m_opcode),
        propertySymOpnd->m_sym->AsPropertySym()->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        propertySymOpnd->m_inlineCacheIndex, propertySymOpnd->GetCacheLayoutString(),
        propertySymOpnd->IsTypeChecked() ? _u("true") : _u("false"));

    if (propertySymOpnd->HasFinalType() && !propertySymOpnd->IsLoadedFromProto())
    {
        propertySymOpnd->UpdateSlotForFinalType();
    }

    Func* func = instrStFld->m_func;

    // TODO (ObjTypeSpec): If ((PropertySym*)propertySymOpnd->m_sym)->m_stackSym->m_isIntConst consider emitting a direct
    // jump to helper or bailout.  If we have a type check bailout, we could even abort compilation.

    bool hasTypeCheckBailout = instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind());

    // If the type hasn't been checked upstream, see if it makes sense to check it here.
    bool isTypeChecked = propertySymOpnd->IsTypeChecked();
    if (!isTypeChecked)
    {
        // If the initial type has been checked, we can do a hard coded type transition without any type checks
        // (see GenerateStFldWithCachedFinalType), which is always worth doing, even if the type is not needed
        // downstream.  We're not introducing any additional bailouts.
        if (propertySymOpnd->HasFinalType() && propertySymOpnd->HasInitialType() && !propertySymOpnd->IsTypeDead())
        {
            // We have a final type in hand, so we can JIT (most of) the type transition work.
            return this->GenerateStFldWithCachedFinalType(instrStFld, propertySymOpnd);
        }

        if (propertySymOpnd->HasTypeMismatch())
        {
            // So we have a type mismatch, which happens when the type (and the type without property if ObjTypeSpecStore
            // is on) on this instruction didn't match the live type value according to the flow. We must have hit some
            // stale inline cache (perhaps inlined from a different function, or on a code path not taken for a while).
            // Either way, we know exactly what type the object must have at this point (fully determined by flow), but
            // we don't know whether that type already has the property we're storing here. All in all, we know exactly
            // what shape the object will have after this operation, but we're not sure what label (type) to give this
            // shape. Thus we can simply let the fast path do its thing based on the live inline cache. The downstream
            // instructions relying only on this shape (loads and stores) are safe, and those that need the next type
            // (i.e. adds) will do the same thing as this instruction.
            return false;
        }

        // If we're still here then we must need a primary type check on this instruction to protect
        // a sequence of field operations downstream, or a local type check for an isolated field store.
        Assert(propertySymOpnd->NeedsPrimaryTypeCheck() || propertySymOpnd->NeedsLocalTypeCheck());

        labelTypeCheckFailed = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        labelBothTypeChecksFailed = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        labelObjCheckFailed = hasTypeCheckBailout ? labelBothTypeChecksFailed : IR::LabelInstr::New(Js::OpCode::Label, func, true);
        typeOpnd = this->GenerateCachedTypeCheck(instrStFld, propertySymOpnd, labelObjCheckFailed, labelBothTypeChecksFailed, labelTypeCheckFailed);
        *typeOpndOut = typeOpnd;
    }

    // Either we are protected by a type check upstream or we just emitted a type check above,
    // now it's time to store the field value.
    GenerateDirectFieldStore(instrStFld, propertySymOpnd);

    // If we are protected by a type check upstream, we don't need a bailout or helper here, delete the instruction
    // and return "true" to indicate that we succeeded in eliminating it.
    if (isTypeChecked)
    {
        Assert(labelTypeCheckFailed == nullptr && labelBothTypeChecksFailed == nullptr);
        AssertMsg(
            !instrStFld->HasBailOutInfo() || instrStFld->OnlyHasLazyBailOut(),
            "Why does a direct field store have bailout that is not lazy?"
        );

        if (propertySymOpnd->HasInitialType() && propertySymOpnd->HasFinalType())
        {
            bool isPrototypeTypeHandler = propertySymOpnd->GetInitialType()->GetTypeHandler()->IsPrototype();
            if (isPrototypeTypeHandler)
            {
                LoadScriptContext(instrStFld);
                m_lowererMD.LoadHelperArgument(instrStFld, IR::IntConstOpnd::New(propertySymOpnd->GetPropertyId(), TyInt32, m_func, true));
                IR::Instr * invalidateCallInstr = IR::Instr::New(Js::OpCode::Call, m_func);
                instrStFld->InsertBefore(invalidateCallInstr);
                m_lowererMD.ChangeToHelperCall(invalidateCallInstr, IR::HelperInvalidateProtoCaches);
            }
        }
        instrStFld->Remove();
        return true;
    }

    // Otherwise, branch around the helper on successful type check.
    labelDone = IR::LabelInstr::New(Js::OpCode::Label, func);
    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, func);
    instrStFld->InsertBefore(instr);

    // On failed type check, try the type without property if we've got one.
    instrStFld->InsertBefore(labelTypeCheckFailed);

    // Caution, this is one of the dusty corners of the JIT.  We only get here if this is an isolated StFld which adds a property, or
    // ObjTypeSpecStore is off.  In the former case no downstream operations depend on the final type produced here, and we can fall
    // back on live cache and helper if the type doesn't match.  In the latter we may have a cache with type transition, which must
    // produce a value for the type after transition, because that type is consumed downstream. Thus, if the object's type doesn't
    // match either the type with or the type without the property we're storing, we must bail out here.
    bool emitAddProperty = propertySymOpnd->IsMono() && propertySymOpnd->HasInitialType();

    if (emitAddProperty)
    {
        GenerateCachedTypeWithoutPropertyCheck(instrStFld, propertySymOpnd, typeOpnd, labelBothTypeChecksFailed);
        GenerateFieldStoreWithTypeChange(instrStFld, propertySymOpnd, propertySymOpnd->GetInitialType(), propertySymOpnd->GetType());
        instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, func);
        instrStFld->InsertBefore(instr);
    }

    instrStFld->InsertBefore(labelBothTypeChecksFailed);
    instrStFld->InsertAfter(labelDone);

    if (hasTypeCheckBailout)
    {
        if (instrStFld->GetBailOutInfo()->bailOutInstr != instrStFld)
        {
            // Set the cache index in the bailout info so that the generated code will write it into the
            // bailout record at runtime.
            instrStFld->GetBailOutInfo()->polymorphicCacheIndex = propertySymOpnd->m_inlineCacheIndex;
        }
        else
        {
            Assert(instrStFld->GetBailOutInfo()->polymorphicCacheIndex == propertySymOpnd->m_inlineCacheIndex);
        }

        instrStFld->m_opcode = Js::OpCode::BailOut;
        instrStFld->FreeSrc1();
        instrStFld->FreeDst();

        this->GenerateBailOut(instrStFld);
        return true;
    }
    else
    {
        *continueAsHelperOut = true;
        Assert(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelBothTypeChecksFailed);
        *labelHelperOut = labelObjCheckFailed;
        return false;
    }
}